

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O3

void docs::run(Options *options,thread_pool *pool,Program *prog)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pLVar2;
  pointer pDVar3;
  pointer pcVar4;
  pointer pDVar5;
  pointer pLVar6;
  pointer pDVar7;
  string templ;
  vector<docs::Doc,_std::allocator<docs::Doc>_> docs;
  mutex docs_mutex;
  string local_c8;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  vector<docs::Doc,_std::allocator<docs::Doc>_> local_88;
  pointer local_68;
  pointer local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_38 = 0;
  local_88.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_88.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  pLVar6 = (prog->lex_data).super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (prog->lex_data).super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar6 != pLVar2) {
    do {
      local_a8._8_8_ = 0;
      local_a8._M_unused._M_object = operator_new(0x18);
      *(pointer *)local_a8._M_unused._0_8_ = pLVar6;
      *(undefined8 **)((long)local_a8._M_unused._0_8_ + 8) = &local_58;
      *(vector<docs::Doc,_std::allocator<docs::Doc>_> **)((long)local_a8._M_unused._0_8_ + 0x10) =
           &local_88;
      local_90 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]cppillr/cppillr/docs.cpp:240:7)>
                 ::_M_invoke;
      local_98 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]cppillr/cppillr/docs.cpp:240:7)>
                 ::_M_manager;
      thread_pool::execute(pool,(function<void_()> *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,3);
      }
      pLVar6 = pLVar6 + 1;
    } while (pLVar6 != pLVar2);
  }
  thread_pool::wait_all(pool);
  local_68 = local_88.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_88.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_c8.field_2;
    pDVar5 = local_88.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pDVar3 = (pDVar5->sections).
               super__Vector_base<docs::DocSection,_std::allocator<docs::DocSection>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_60 = pDVar5;
      for (pDVar7 = (pDVar5->sections).
                    super__Vector_base<docs::DocSection,_std::allocator<docs::DocSection>_>._M_impl.
                    super__Vector_impl_data._M_start; pDVar7 != pDVar3; pDVar7 = pDVar7 + 1) {
        local_a8._M_unused._M_object = &local_98;
        pcVar4 = (options->print)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar4,pcVar4 + (options->print)._M_string_length);
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"{id}","");
        replace_string((string *)&local_a8,&local_c8,&pDVar7->id);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"{type}","");
        replace_string((string *)&local_a8,&local_c8,&pDVar7->type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"{line}","");
        replace_string((string *)&local_a8,&local_c8,&pDVar7->line);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"{desc}","");
        replace_string((string *)&local_a8,&local_c8,&pDVar7->desc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_a8._8_8_ != 0) {
          puts((char *)local_a8._M_unused._0_8_);
        }
        if ((code **)local_a8._M_unused._0_8_ != &local_98) {
          operator_delete(local_a8._M_unused._M_object,(ulong)(local_98 + 1));
        }
      }
      pDVar5 = local_60 + 1;
    } while (pDVar5 != local_68);
  }
  std::vector<docs::Doc,_std::allocator<docs::Doc>_>::~vector(&local_88);
  return;
}

Assistant:

void run(
  const Options& options,
  thread_pool& pool,
  const Program& prog)
{
  std::mutex docs_mutex;
  std::vector<Doc> docs;

  for (const auto& data : prog.lex_data) {
    pool.execute(
      [&data, &docs_mutex, &docs]() {
        Doc doc = process_file(data);
        {
          std::unique_lock<std::mutex> l(docs_mutex);
          docs.emplace_back(std::move(doc));
        }
      });
  }

  pool.wait_all();

  // Generate markdown file

  for (const Doc& doc : docs) {
    for (const DocSection& sec : doc.sections) {
      std::string templ = options.print;
      replace_string(templ, "{id}", sec.id);
      replace_string(templ, "{type}", sec.type);
      replace_string(templ, "{line}", sec.line);
      replace_string(templ, "{desc}", sec.desc);
      if (!templ.empty())
        std::puts(templ.c_str());
    }
  }
}